

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void P_TraceBleed(int damage,AActor *target,DAngle *angle,DAngle *pitch)

{
  DAngle *actor;
  TAngle<double> local_50;
  TAngle<double> local_48;
  DVector3 local_40;
  DAngle *local_28;
  DAngle *pitch_local;
  DAngle *angle_local;
  AActor *target_local;
  int damage_local;
  
  local_28 = pitch;
  pitch_local = angle;
  angle_local = (DAngle *)target;
  target_local._4_4_ = damage;
  AActor::PosPlusZ(&local_40,target,target->Height / 2.0);
  actor = angle_local;
  TAngle<double>::TAngle(&local_48,angle);
  TAngle<double>::TAngle(&local_50,pitch);
  P_TraceBleed(damage,&local_40,(AActor *)actor,&local_48,&local_50);
  return;
}

Assistant:

void P_TraceBleed(int damage, AActor *target, DAngle angle, DAngle pitch)
{
	P_TraceBleed(damage, target->PosPlusZ(target->Height/2), target, angle, pitch);
}